

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void computeLimitRegisters(Parse *pParse,Select *p,int iBreak)

{
  byte *pbVar1;
  short sVar2;
  Expr *pExpr;
  LogEst LVar3;
  int iVar4;
  undefined8 in_RAX;
  Vdbe *p_00;
  int target;
  int iVar5;
  ulong x;
  int n;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  if (p->iLimit != 0) {
    return;
  }
  sqlite3ExprCacheClear(pParse);
  if (p->pLimit == (Expr *)0x0) {
    return;
  }
  target = pParse->nMem + 1;
  pParse->nMem = target;
  p->iLimit = target;
  p_00 = pParse->pVdbe;
  if (p_00 == (Vdbe *)0x0) {
    p_00 = allocVdbe(pParse);
  }
  iVar4 = sqlite3ExprIsInteger(p->pLimit,(int *)&local_34);
  if (iVar4 == 0) {
    sqlite3ExprCode(pParse,p->pLimit,target);
    sqlite3VdbeAddOp3(p_00,0x11,target,0,0);
    iVar5 = 0x16;
    iVar4 = target;
  }
  else {
    x = (ulong)local_34;
    sqlite3VdbeAddOp3(p_00,0x38,local_34,target,0);
    if (x != 0) {
      if ((-1 < (int)local_34) && (sVar2 = p->nSelectRow, LVar3 = sqlite3LogEst(x), LVar3 < sVar2))
      {
        LVar3 = sqlite3LogEst(x);
        p->nSelectRow = LVar3;
        pbVar1 = (byte *)((long)&p->selFlags + 1);
        *pbVar1 = *pbVar1 | 0x40;
      }
      goto LAB_002414ae;
    }
    iVar5 = 0xd;
    iVar4 = 0;
  }
  sqlite3VdbeAddOp3(p_00,iVar5,iVar4,iBreak,0);
LAB_002414ae:
  pExpr = p->pOffset;
  if (pExpr == (Expr *)0x0) {
    return;
  }
  iVar5 = pParse->nMem;
  iVar4 = iVar5 + 1;
  pParse->nMem = iVar4;
  p->iOffset = iVar4;
  iVar5 = iVar5 + 2;
  pParse->nMem = iVar5;
  sqlite3ExprCode(pParse,pExpr,iVar4);
  sqlite3VdbeAddOp3(p_00,0x11,iVar4,0,0);
  sqlite3VdbeAddOp3(p_00,0x93,target,iVar5,iVar4);
  return;
}

Assistant:

static void computeLimitRegisters(Parse *pParse, Select *p, int iBreak){
  Vdbe *v = 0;
  int iLimit = 0;
  int iOffset;
  int n;
  if( p->iLimit ) return;

  /* 
  ** "LIMIT -1" always shows all rows.  There is some
  ** controversy about what the correct behavior should be.
  ** The current implementation interprets "LIMIT 0" to mean
  ** no rows.
  */
  sqlite3ExprCacheClear(pParse);
  assert( p->pOffset==0 || p->pLimit!=0 );
  if( p->pLimit ){
    p->iLimit = iLimit = ++pParse->nMem;
    v = sqlite3GetVdbe(pParse);
    assert( v!=0 );
    if( sqlite3ExprIsInteger(p->pLimit, &n) ){
      sqlite3VdbeAddOp2(v, OP_Integer, n, iLimit);
      VdbeComment((v, "LIMIT counter"));
      if( n==0 ){
        sqlite3VdbeGoto(v, iBreak);
      }else if( n>=0 && p->nSelectRow>sqlite3LogEst((u64)n) ){
        p->nSelectRow = sqlite3LogEst((u64)n);
        p->selFlags |= SF_FixedLimit;
      }
    }else{
      sqlite3ExprCode(pParse, p->pLimit, iLimit);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, iLimit); VdbeCoverage(v);
      VdbeComment((v, "LIMIT counter"));
      sqlite3VdbeAddOp2(v, OP_IfNot, iLimit, iBreak); VdbeCoverage(v);
    }
    if( p->pOffset ){
      p->iOffset = iOffset = ++pParse->nMem;
      pParse->nMem++;   /* Allocate an extra register for limit+offset */
      sqlite3ExprCode(pParse, p->pOffset, iOffset);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, iOffset); VdbeCoverage(v);
      VdbeComment((v, "OFFSET counter"));
      sqlite3VdbeAddOp3(v, OP_OffsetLimit, iLimit, iOffset+1, iOffset);
      VdbeComment((v, "LIMIT+OFFSET"));
    }
  }
}